

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone_motion::load_2(xr_bone_motion *this,xr_reader *r)

{
  uint8_t uVar1;
  long local_20;
  uint_fast32_t i;
  xr_reader *r_local;
  xr_bone_motion *this_local;
  
  xr_reader::r_sz(r,&this->m_name);
  uVar1 = xr_reader::r_u8(r);
  this->m_flags = uVar1;
  create_envelopes(this);
  for (local_20 = 0; local_20 != 6; local_20 = local_20 + 1) {
    xr_envelope::load_2(this->m_envelopes[local_20],r);
  }
  return;
}

Assistant:

void xr_bone_motion::load_2(xr_reader& r)
{
	r.r_sz(m_name);
	m_flags = r.r_u8();
	create_envelopes();
	for (uint_fast32_t i = 0; i != 6; ++i)
		m_envelopes[i]->load_2(r);
}